

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

void __thiscall RuntimeObjectSystem::~RuntimeObjectSystem(RuntimeObjectSystem *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BuildTool *this_00;
  pointer pcVar2;
  pointer ppvVar3;
  
  (this->super_IRuntimeObjectSystem).super_ITestBuildNotifier._vptr_ITestBuildNotifier =
       (_func_int **)&PTR__RuntimeObjectSystem_00119908;
  (this->super_IFileChangeListener)._vptr_IFileChangeListener = (_func_int **)&DAT_00119a48;
  (**(code **)(*(long *)this->m_pFileChangeNotifier + 0x40))
            (this->m_pFileChangeNotifier,&this->super_IFileChangeListener);
  DeletePlatformImpl(this);
  if (this->m_pObjectFactorySystem != (IObjectFactorySystem *)0x0) {
    (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[0xd])();
  }
  if (this->m_pFileChangeNotifier != (IFileChangeNotifier *)0x0) {
    (**(code **)(*(long *)this->m_pFileChangeNotifier + 0x50))();
  }
  this_00 = this->m_pBuildTool;
  if (this_00 != (BuildTool *)0x0) {
    BuildTool::~BuildTool(this_00);
    operator_delete(this_00,0x18);
  }
  std::
  _Rb_tree<FileSystemUtils::Path,_std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>,_std::_Select1st<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
  ::~_Rb_tree(&(this->m_FoundSourceDirectoryMappings)._M_t);
  std::
  vector<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
  ::~vector(&this->m_Projects);
  (this->m_CurrentlyCompilingModuleName)._vptr_Path = (_func_int **)&PTR__Path_001198d8;
  pcVar2 = (this->m_CurrentlyCompilingModuleName).m_string._M_dataplus._M_p;
  paVar1 = &(this->m_CurrentlyCompilingModuleName).m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppvVar3 = (this->m_Modules).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar3 != (pointer)0x0) {
    operator_delete(ppvVar3,(long)(this->m_Modules).
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppvVar3);
  }
  std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
            (&this->linkLibraryList);
  IFileChangeListener::~IFileChangeListener(&this->super_IFileChangeListener);
  return;
}

Assistant:

RuntimeObjectSystem::~RuntimeObjectSystem()
{
	m_pFileChangeNotifier->RemoveListener(this);
    DeletePlatformImpl();
	delete m_pObjectFactorySystem;
	delete m_pFileChangeNotifier;
	delete m_pBuildTool;

	// Note we do not delete compiler logger, creator should do this
}